

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O3

int __thiscall
chrono::ChBezierCurveTracker::calcClosestPoint
          (ChBezierCurveTracker *this,ChVector<double> *loc,ChVector<double> *point)

{
  ChBezierCurve *this_00;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double p_m;
  ChVector<double> pt_m;
  double local_40;
  ChVector<double> local_38;
  
  ChBezierCurve::calcClosestPoint
            (&local_38,*(ChBezierCurve **)this,loc,*(size_t *)(this + 0x10),(double *)(this + 0x18))
  ;
  point->m_data[0] = local_38.m_data[0];
  point->m_data[1] = local_38.m_data[1];
  point->m_data[2] = local_38.m_data[2];
  if (1e-05 <= *(double *)(this + 0x18)) {
    if (*(double *)(this + 0x18) <= 0.99999) {
      return 0;
    }
    this_00 = *(ChBezierCurve **)this;
    if ((*(long *)(this + 0x10) ==
         ((long)(this_00->m_points).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this_00->m_points).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + -2) &&
       (this[0x20] != (ChBezierCurveTracker)0x1)) {
      return 1;
    }
    ChBezierCurve::calcClosestPoint(&local_38,this_00,loc,*(long *)(this + 0x10) + 1,&local_40);
    dVar1 = local_38.m_data[1] - loc->m_data[1];
    dVar2 = point->m_data[1] - loc->m_data[1];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_38.m_data[0] - loc->m_data[0];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar1 * dVar1;
    auVar9 = vfmadd231sd_fma(auVar12,auVar9,auVar9);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_38.m_data[2] - loc->m_data[2];
    auVar9 = vfmadd231sd_fma(auVar9,auVar14,auVar14);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = point->m_data[0] - loc->m_data[0];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar2 * dVar2;
    auVar4 = vfmadd231sd_fma(auVar6,auVar4,auVar4);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = point->m_data[2] - loc->m_data[2];
    auVar4 = vfmadd231sd_fma(auVar4,auVar10,auVar10);
    if (auVar4._0_8_ <= auVar9._0_8_) {
      return 0;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    if ((*(long *)(this + 0x10) == 0) && (this[0x20] != (ChBezierCurveTracker)0x1)) {
      return -1;
    }
    ChBezierCurve::calcClosestPoint
              (&local_38,*(ChBezierCurve **)this,loc,*(long *)(this + 0x10) - 1,&local_40);
    dVar1 = local_38.m_data[1] - loc->m_data[1];
    dVar2 = point->m_data[1] - loc->m_data[1];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_38.m_data[0] - loc->m_data[0];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar1 * dVar1;
    auVar9 = vfmadd231sd_fma(auVar11,auVar7,auVar7);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_38.m_data[2] - loc->m_data[2];
    auVar9 = vfmadd231sd_fma(auVar9,auVar13,auVar13);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = point->m_data[0] - loc->m_data[0];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar2 * dVar2;
    auVar4 = vfmadd231sd_fma(auVar5,auVar3,auVar3);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = point->m_data[2] - loc->m_data[2];
    auVar4 = vfmadd231sd_fma(auVar4,auVar8,auVar8);
    if (auVar4._0_8_ <= auVar9._0_8_) {
      return 0;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + -1;
  }
  *(double *)(this + 0x18) = local_40;
  point->m_data[0] = local_38.m_data[0];
  point->m_data[1] = local_38.m_data[1];
  point->m_data[2] = local_38.m_data[2];
  return 0;
}

Assistant:

int ChBezierCurveTracker::calcClosestPoint(const ChVector<>& loc, ChVector<>& point) {
    // Evaluate in current interval
    point = m_path->calcClosestPoint(loc, m_curInterval, m_curParam);

    if (m_curParam < ChBezierCurve::m_paramTol) {
        // Close to lower limit
        if ((m_curInterval == 0) && (!m_isClosedPath))
            return -1;

        // Check previous interval
        double p_m;
        auto pt_m = m_path->calcClosestPoint(loc, m_curInterval - 1, p_m);

        if ((pt_m - loc).Length2() < (point - loc).Length2()) {
            ////std::cout << "loc = " << loc << "  DECREASE to " << m_curInterval - 1 << "  p = " << p_m
            ////          << "    point: " << point << "  point minus: " << pt_m << std::endl;
            m_curInterval--;
            m_curParam = p_m;
            point = pt_m;
        }

        return 0;

    } else if (m_curParam > 1 - ChBezierCurve::m_paramTol) {
        // Close to upper limit
        if ((m_curInterval == m_path->getNumPoints() - 2) && (!m_isClosedPath))
            return +1;

        // Check next interval
        double p_p;
        auto pt_p = m_path->calcClosestPoint(loc, m_curInterval + 1, p_p);

        if ((pt_p - loc).Length2() < (point - loc).Length2()) {
            ////std::cout << "loc = " << loc << "  INCREASE to " << m_curInterval + 1 << "  p = " << p_p
            ////          << "    point: " << point << "  point plus: " << pt_p << std::endl;
            m_curInterval++;
            m_curParam = p_p;
            point = pt_p;
        }

        return 0;
    } else {
        // Not close to interval bounds. Done
        return 0;
    }
    
    /*
    bool lastAtMin = false;
    bool lastAtMax = false;

    while (true) {
        point = m_path->calcClosestPoint(loc, m_curInterval, m_curParam);

        if (m_curParam < ChBezierCurve::m_paramTol) {
            if ((m_curInterval == 0) && (!m_isClosedPath))
                return -1;

            if (lastAtMax)
                return 0;

            // If the search region is at the beginning of the interval check the 
            // previous interval.  Loop to the last interval if the path is a 
            // closed loop and is it is currently in the first interval
            if ((m_curInterval == 0) && (m_isClosedPath))
                m_curInterval = m_path->getNumPoints() - 2; 
            else
                m_curInterval--;

            lastAtMin = true;
            m_curParam = 1;
        } else if (m_curParam > 1 - ChBezierCurve::m_paramTol) {
            if ((m_curInterval == m_path->getNumPoints() - 2) && (!m_isClosedPath))
                return +1;

            if (lastAtMin)
                return 0;

            // If the search region is at the end of the interval check the 
            // next interval.  Loop to the first interval if the path is a 
            // closed loop and is it is currently in the last interval
            if ((m_curInterval == m_path->getNumPoints() - 2) && (m_isClosedPath))
                m_curInterval = 0;
            else
                m_curInterval++;

            lastAtMax = true;
            m_curParam = 0;
        } else
            return 0;
    }
    */
}